

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void OPL3_RhythmSetupAlg(opl3_chip *chip)

{
  int16_t *local_78;
  int16_t *local_70;
  int16_t *local_68;
  int16_t *local_60;
  int16_t *local_58;
  int16_t *local_50;
  int16_t *local_48;
  int16_t *local_40;
  int16_t *local_38;
  int16_t *local_30;
  opl3_channel *channel8;
  opl3_channel *channel7;
  opl3_channel *channel6;
  opl3_chip *chip_local;
  
  if ((chip->muteMask & 0x40000) == 0) {
    local_30 = &chip->channel[6].slotz[1]->out;
  }
  else {
    local_30 = &zeromod;
  }
  chip->channel[6].out[0] = local_30;
  if ((chip->muteMask & 0x40000) == 0) {
    local_38 = &chip->channel[6].slotz[1]->out;
  }
  else {
    local_38 = &zeromod;
  }
  chip->channel[6].out[1] = local_38;
  chip->channel[6].out[2] = &zeromod;
  chip->channel[6].out[3] = &zeromod;
  if ((chip->muteMask & 0x400000) == 0) {
    local_40 = &chip->channel[7].slotz[0]->out;
  }
  else {
    local_40 = &zeromod;
  }
  chip->channel[7].out[0] = local_40;
  if ((chip->muteMask & 0x400000) == 0) {
    local_48 = &chip->channel[7].slotz[0]->out;
  }
  else {
    local_48 = &zeromod;
  }
  chip->channel[7].out[1] = local_48;
  if ((chip->muteMask & 0x80000) == 0) {
    local_50 = &chip->channel[7].slotz[1]->out;
  }
  else {
    local_50 = &zeromod;
  }
  chip->channel[7].out[2] = local_50;
  if ((chip->muteMask & 0x80000) == 0) {
    local_58 = &chip->channel[7].slotz[1]->out;
  }
  else {
    local_58 = &zeromod;
  }
  chip->channel[7].out[3] = local_58;
  if ((chip->muteMask & 0x100000) == 0) {
    local_60 = &chip->channel[8].slotz[0]->out;
  }
  else {
    local_60 = &zeromod;
  }
  chip->channel[8].out[0] = local_60;
  if ((chip->muteMask & 0x100000) == 0) {
    local_68 = &chip->channel[8].slotz[0]->out;
  }
  else {
    local_68 = &zeromod;
  }
  chip->channel[8].out[1] = local_68;
  if ((chip->muteMask & 0x200000) == 0) {
    local_70 = &chip->channel[8].slotz[1]->out;
  }
  else {
    local_70 = &zeromod;
  }
  chip->channel[8].out[2] = local_70;
  if ((chip->muteMask & 0x200000) == 0) {
    local_78 = &chip->channel[8].slotz[1]->out;
  }
  else {
    local_78 = &zeromod;
  }
  chip->channel[8].out[3] = local_78;
  return;
}

Assistant:

static void OPL3_RhythmSetupAlg(opl3_chip *chip)
{
    opl3_channel *channel6 = &chip->channel[6];
    opl3_channel *channel7 = &chip->channel[7];
    opl3_channel *channel8 = &chip->channel[8];
    channel6->out[0] = (chip->muteMask & (1 << mch_bd)) ? &zeromod : &channel6->slotz[1]->out;
    channel6->out[1] = (chip->muteMask & (1 << mch_bd)) ? &zeromod : &channel6->slotz[1]->out;
    channel6->out[2] = &zeromod;
    channel6->out[3] = &zeromod;
    channel7->out[0] = (chip->muteMask & (1 << mch_hh)) ? &zeromod : &channel7->slotz[0]->out;
    channel7->out[1] = (chip->muteMask & (1 << mch_hh)) ? &zeromod : &channel7->slotz[0]->out;
    channel7->out[2] = (chip->muteMask & (1 << mch_sd)) ? &zeromod : &channel7->slotz[1]->out;
    channel7->out[3] = (chip->muteMask & (1 << mch_sd)) ? &zeromod : &channel7->slotz[1]->out;
    channel8->out[0] = (chip->muteMask & (1 << mch_tt)) ? &zeromod : &channel8->slotz[0]->out;
    channel8->out[1] = (chip->muteMask & (1 << mch_tt)) ? &zeromod : &channel8->slotz[0]->out;
    channel8->out[2] = (chip->muteMask & (1 << mch_tc)) ? &zeromod : &channel8->slotz[1]->out;
    channel8->out[3] = (chip->muteMask & (1 << mch_tc)) ? &zeromod : &channel8->slotz[1]->out;
}